

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_lower_bound_Test::TestBody(test_matrix_sparse_lower_bound_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char *pcVar9;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  AssertionResult gtest_ar;
  unsigned_long local_158;
  matrix_type *pmStack_150;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_17;
  pointer local_110;
  undefined1 local_108 [8];
  pointer local_100;
  Matrix_Sparse matrix_const;
  size_t local_a0 [2];
  Matrix_Sparse matrix;
  
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  matrix_const.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_158 = 2;
  gtest_ar_4._0_8_ = &DAT_4008000000000000;
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  value._M_len = 3;
  value._M_array = (iterator)&gtest_ar_4;
  index._M_len = 3;
  index._M_array = (iterator)&gtest_ar;
  non_zero._M_len = 4;
  non_zero._M_array = (iterator)&matrix_const;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix,non_zero,index,value,3);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  auVar8._12_4_ = 0;
  auVar8._0_12_ = stack0xfffffffffffffefc;
  _local_108 = (value_type)(auVar8 << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(0, 0).i_row()","0",
             (unsigned_long *)
             &matrix_const.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e5,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(0, 0).i_column()","1",
             matrix_const.row_non_zero.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e6,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  auVar1._12_4_ = 0;
  auVar1._0_12_ = stack0xfffffffffffffefc;
  _local_108 = (value_type)(auVar1 << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(0, 1).i_row()","0",
             (unsigned_long *)
             &matrix_const.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e7,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(0, 1).i_column()","1",
             matrix_const.row_non_zero.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e8,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_100;
  _local_108 = (value_type)(auVar2 << 0x40);
  local_110 = (pointer)0x2;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)local_108,(size_t *)&local_110);
  local_a0[0] = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_17,(size_t *)&matrix);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)&gtest_ar,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&gtest_ar_17);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>>
            ((internal *)&gtest_ar_4,"matrix.lower_bound(0, 2)","matrix[0].end()",
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&matrix_const,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e9,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&matrix_const);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(1, 0).i_row()","1",
             (unsigned_long *)
             &matrix_const.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1eb,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  auVar3._12_4_ = 0;
  auVar3._0_12_ = stack0xfffffffffffffefc;
  _local_108 = (value_type)(auVar3 << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(1, 0).i_column()","0",
             matrix_const.row_non_zero.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ec,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(1, 1).i_row()","1",
             (unsigned_long *)
             &matrix_const.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ed,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(1, 1).i_column()","2",
             matrix_const.row_non_zero.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ee,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(1, 2).i_row()","1",
             (unsigned_long *)
             &matrix_const.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ef,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)&gtest_ar_4,(size_t *)&gtest_ar_17)
  ;
  local_108._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.lower_bound(1, 2).i_column()","2",
             matrix_const.row_non_zero.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f0,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&matrix_const)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_108 = (undefined1  [8])0x2;
  local_110 = (pointer)0x0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)local_108,(size_t *)&local_110);
  local_a0[0] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_17,(size_t *)&matrix);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)&gtest_ar,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&gtest_ar_17);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>>
            ((internal *)&gtest_ar_4,"matrix.lower_bound(2, 0)","matrix[2].end()",
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&matrix_const,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f2,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&matrix_const);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_108 = (undefined1  [8])0x3;
  local_110 = (pointer)0x3;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&matrix_const,&matrix,(size_t *)local_108,(size_t *)&local_110);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)&gtest_ar_17);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)&gtest_ar,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&gtest_ar_17);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>>
            ((internal *)&gtest_ar_4,"matrix.lower_bound(3, 3)","matrix.end()->end()",
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&matrix_const,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&matrix_const);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,499,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&matrix_const);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (matrix_const.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*matrix_const.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_158 = 3;
  pmStack_150 = (matrix_type *)0x3;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x1;
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_17._0_8_ = &DAT_4008000000000000;
  gtest_ar_17.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  value_00._M_len = 3;
  value_00._M_array = (iterator)&gtest_ar_17;
  index_00._M_len = 3;
  index_00._M_array = (iterator)&gtest_ar_4;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = (iterator)&gtest_ar;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix_const,non_zero_00,index_00,value_00,3);
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_100;
  _local_108 = (value_type)(auVar4 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)((ulong)local_110 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(0, 0).i_row()","0",&local_158,
             (int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f6,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_100;
  _local_108 = (value_type)(auVar5 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(0, 0).i_column()","1",
             (unsigned_long *)gtest_ar._0_8_,(int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f7,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  local_108 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)((ulong)local_110 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(0, 1).i_row()","0",&local_158,
             (int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f8,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_7_ = 0;
  local_108 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(0, 1).i_column()","1",
             (unsigned_long *)gtest_ar._0_8_,(int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f9,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_110 = (pointer)0x0;
  local_a0[0] = 2;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&local_110,local_a0);
  local_a0[1] = 0;
  _local_108 = Disa::Matrix_Sparse::operator[](&matrix_const,local_a0 + 1);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
            ((iterator *)&gtest_ar_4,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_108);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>>
            ((internal *)&gtest_ar_17,"matrix_const.lower_bound(0, 2)","matrix_const[0].end()",
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&gtest_ar,
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&gtest_ar_4);
  if (gtest_ar_17.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_17.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_17.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fa,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_17.message_);
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_100;
  _local_108 = (value_type)(auVar6 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(1, 0).i_row()","1",&local_158,
             (int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fc,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_100;
  _local_108 = (value_type)(auVar7 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)((ulong)local_110 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(1, 0).i_column()","0",
             (unsigned_long *)gtest_ar._0_8_,(int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fd,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  local_108 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(1, 1).i_row()","1",&local_158,
             (int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fe,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  local_108 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(1, 1).i_column()","2",
             (unsigned_long *)gtest_ar._0_8_,(int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ff,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  local_108 = (undefined1  [8])0x2;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(1, 2).i_row()","1",&local_158,
             (int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x200,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_17.success_ = true;
  gtest_ar_17._1_7_ = 0;
  local_108 = (undefined1  [8])0x2;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&gtest_ar_17,
             (size_t *)local_108);
  local_110 = (pointer)CONCAT44(local_110._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"matrix_const.lower_bound(1, 2).i_column()","2",
             (unsigned_long *)gtest_ar._0_8_,(int *)&local_110);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x201,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_110 = (pointer)0x2;
  local_a0[0] = 0;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&local_110,local_a0);
  local_a0[1] = 2;
  _local_108 = Disa::Matrix_Sparse::operator[](&matrix_const,local_a0 + 1);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
            ((iterator *)&gtest_ar_4,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_108);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>>
            ((internal *)&gtest_ar_17,"matrix_const.lower_bound(2, 0)","matrix_const[2].end()",
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&gtest_ar,
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&gtest_ar_4);
  if (gtest_ar_17.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_17.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_17.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x203,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_17.message_);
  local_110 = (pointer)0x3;
  local_a0[0] = 3;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)&gtest_ar,&matrix_const,(size_t *)&local_110,local_a0);
  _local_108 = (value_type)Disa::Matrix_Sparse::end(&matrix_const);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
            ((iterator *)&gtest_ar_4,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_108);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>>
            ((internal *)&gtest_ar_17,"matrix_const.lower_bound(3, 3)","(*matrix_const.end()).end()"
             ,(Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&gtest_ar,
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)&gtest_ar_4);
  if (gtest_ar_17.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_17.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)gtest_ar_17.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x204,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_17.message_);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_const);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix);
  return;
}

Assistant:

TEST(test_matrix_sparse, lower_bound) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix.lower_bound(0, 0).i_row(), 0);
  EXPECT_EQ(matrix.lower_bound(0, 0).i_column(), 1);
  EXPECT_EQ(matrix.lower_bound(0, 1).i_row(), 0);
  EXPECT_EQ(matrix.lower_bound(0, 1).i_column(), 1);
  EXPECT_EQ(matrix.lower_bound(0, 2), matrix[0].end());

  EXPECT_EQ(matrix.lower_bound(1, 0).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 0).i_column(), 0);
  EXPECT_EQ(matrix.lower_bound(1, 1).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 1).i_column(), 2);
  EXPECT_EQ(matrix.lower_bound(1, 2).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 2).i_column(), 2);

  EXPECT_EQ(matrix.lower_bound(2, 0), matrix[2].end());
  EXPECT_EQ(matrix.lower_bound(3, 3), matrix.end()->end());

  const Matrix_Sparse matrix_const({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix_const.lower_bound(0, 0).i_row(), 0);
  EXPECT_EQ(matrix_const.lower_bound(0, 0).i_column(), 1);
  EXPECT_EQ(matrix_const.lower_bound(0, 1).i_row(), 0);
  EXPECT_EQ(matrix_const.lower_bound(0, 1).i_column(), 1);
  EXPECT_EQ(matrix_const.lower_bound(0, 2), matrix_const[0].end());

  EXPECT_EQ(matrix_const.lower_bound(1, 0).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 0).i_column(), 0);
  EXPECT_EQ(matrix_const.lower_bound(1, 1).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 1).i_column(), 2);
  EXPECT_EQ(matrix_const.lower_bound(1, 2).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 2).i_column(), 2);

  EXPECT_EQ(matrix_const.lower_bound(2, 0), matrix_const[2].end());
  EXPECT_EQ(matrix_const.lower_bound(3, 3), (*matrix_const.end()).end());
}